

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int on_data_chunk_recv(nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *mem,
                      size_t len,void *userp)

{
  Curl_easy *local_78;
  Curl_easy *local_70;
  size_t local_68;
  CURLcode local_5c;
  ssize_t sStack_58;
  CURLcode result;
  ssize_t nwritten;
  Curl_easy *data_s;
  stream_ctx *stream;
  Curl_cfilter *cf;
  void *userp_local;
  size_t len_local;
  uint8_t *mem_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  stream = (stream_ctx *)userp;
  cf = (Curl_cfilter *)userp;
  userp_local = (void *)len;
  len_local = (size_t)mem;
  mem_local._0_4_ = stream_id;
  mem_local._7_1_ = flags;
  _stream_id_local = session;
  nwritten = (ssize_t)nghttp2_session_get_stream_user_data(session,stream_id);
  if ((void *)nwritten == (void *)0x0) {
    if ((stream != (stream_ctx *)0x0) && (((stream->recvbuf).tail)->r_offset != 0)) {
      if (stream == (stream_ctx *)0x0) {
        local_68 = 0;
      }
      else {
        local_68 = ((stream->recvbuf).tail)->r_offset;
      }
      if ((((*(ulong *)(local_68 + 0xa52) >> 0x1c & 1) != 0) && (stream != (stream_ctx *)0x0)) &&
         (0 < *(int *)(*(long *)stream + 0xc))) {
        if (stream == (stream_ctx *)0x0) {
          local_70 = (Curl_easy *)0x0;
        }
        else {
          local_70 = (Curl_easy *)((stream->recvbuf).tail)->r_offset;
        }
        Curl_trc_cf_infof(local_70,(Curl_cfilter *)stream,"[%d] Data for unknown",
                          (ulong)(uint)mem_local);
      }
    }
    nghttp2_session_consume(_stream_id_local,(uint)mem_local,(size_t)userp_local);
    session_local._4_4_ = 0;
  }
  else {
    if (((void *)nwritten == (void *)0x0) || (*(long *)(nwritten + 0x180) == 0)) {
      local_78 = (Curl_easy *)0x0;
    }
    else {
      local_78 = *(Curl_easy **)(*(long *)(nwritten + 0x180) + 0x40);
    }
    data_s = local_78;
    if (local_78 == (Curl_easy *)0x0) {
      session_local._4_4_ = -0x386;
    }
    else {
      sStack_58 = Curl_bufq_write((bufq *)&local_78->id,(uchar *)len_local,(size_t)userp_local,
                                  &local_5c);
      if (sStack_58 < 0) {
        if (local_5c != CURLE_AGAIN) {
          return -0x386;
        }
        sStack_58 = 0;
      }
      drain_stream((Curl_cfilter *)stream,(Curl_easy *)nwritten,(stream_ctx *)data_s);
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int on_data_chunk_recv(nghttp2_session *session, uint8_t flags,
                              int32_t stream_id,
                              const uint8_t *mem, size_t len, void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct stream_ctx *stream;
  struct Curl_easy *data_s;
  ssize_t nwritten;
  CURLcode result;
  (void)flags;

  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */
  DEBUGASSERT(CF_DATA_CURRENT(cf));

  /* get the stream from the hash based on Stream ID */
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    /* Receiving a Stream ID not in the hash should not happen - unless
       we have aborted a transfer artificially and there were more data
       in the pipeline. Silently ignore. */
    CURL_TRC_CF(CF_DATA_CURRENT(cf), cf, "[%d] Data for unknown",
                stream_id);
    /* consumed explicitly as no one will read it */
    nghttp2_session_consume(session, stream_id, len);
    return 0;
  }

  stream = H2_STREAM_CTX(data_s);
  if(!stream)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  nwritten = Curl_bufq_write(&stream->recvbuf, mem, len, &result);
  if(nwritten < 0) {
    if(result != CURLE_AGAIN)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    nwritten = 0;
  }

  /* if we receive data for another handle, wake that up */
  drain_stream(cf, data_s, stream);

  DEBUGASSERT((size_t)nwritten == len);
  return 0;
}